

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O0

void __thiscall
simple_thread_pool::ThreadHandle::ThreadHandle(ThreadHandle *this,ThreadPoolMgrBase *m,size_t id)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  nullptr_t in_stack_ffffffffffffffa8;
  EventAwaiter *this_00;
  
  *in_RDI = in_RDX;
  in_RDI[1] = in_RSI;
  this_00 = (EventAwaiter *)(in_RDI + 2);
  std::shared_ptr<simple_thread_pool::ThreadHandle>::shared_ptr
            ((shared_ptr<simple_thread_pool::ThreadHandle> *)this_00,in_stack_ffffffffffffffa8);
  std::shared_ptr<std::thread>::shared_ptr
            ((shared_ptr<std::thread> *)this_00,in_stack_ffffffffffffffa8);
  std::shared_ptr<simple_thread_pool::TaskHandle>::shared_ptr
            ((shared_ptr<simple_thread_pool::TaskHandle> *)this_00,in_stack_ffffffffffffffa8);
  std::mutex::mutex((mutex *)0x109383);
  EventAwaiter::EventAwaiter(this_00);
  return;
}

Assistant:

ThreadHandle(ThreadPoolMgrBase* m,
                 size_t id)
        : myId(id)
        , mgr(m)
        , myself(nullptr)
        , tHandle(nullptr)
        , assignedTask(nullptr)
        {}